

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlif.c
# Opt level: O2

int Io_ReadFindCiId(Abc_Ntk_t *pNtk,Abc_Obj_t *pObj)

{
  Abc_Obj_t *pAVar1;
  int iVar2;
  int i;
  
  i = 0;
  while ((iVar2 = -1, i < pNtk->vCis->nSize &&
         (pAVar1 = (Abc_Obj_t *)Vec_PtrEntry(pNtk->vCis,i), iVar2 = i, pAVar1 != pObj))) {
    i = i + 1;
  }
  return iVar2;
}

Assistant:

int Io_ReadFindCiId( Abc_Ntk_t * pNtk, Abc_Obj_t * pObj )
{
    Abc_Obj_t * pTemp;
    int i;
    Abc_NtkForEachCi( pNtk, pTemp, i )
        if ( pTemp == pObj )
            return i;
    return -1;
}